

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O1

string * StringBuilder<char[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
                   (string *__return_storage_ptr__,char (*arg) [5],int *args,char (*args_1) [5],
                   int *args_2,char (*args_3) [4])

{
  size_type *psVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  std::__cxx11::string::string((string *)&local_48,*arg,(allocator *)&local_68);
  StringBuilder<int,char_const(&)[5],int_const&,char_const(&)[4]>
            (&local_68,args,args_1,args_2,args_3);
  uVar3 = 0xf;
  if (local_48 != local_38) {
    uVar3 = local_38[0];
  }
  if (uVar3 < local_68._M_string_length + local_40) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar4 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_40 <= (ulong)uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_0013b99a;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
LAB_0013b99a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar4 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}